

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool __thiscall
chaiscript::detail::Dispatch_Engine::is_attribute_call
          (Dispatch_Engine *this,
          vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funs,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                  *t_params,bool t_has_params,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  const_reference pvVar4;
  byte in_CL;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *in_RDX;
  undefined8 in_R8;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *fun;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
  *__range2;
  element_type *in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
  in_stack_ffffffffffffffc0;
  
  if (((in_CL & 1) != 0) &&
     (bVar1 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::empty
                        ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                          *)in_stack_ffffffffffffffc0._M_current), !bVar1)) {
    std::
    vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
    ::begin((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
             *)in_stack_ffffffffffffffa8);
    std::
    vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
    ::end((vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           *)in_stack_ffffffffffffffa8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)in_stack_ffffffffffffffb0,
                              (__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                               *)in_stack_ffffffffffffffa8), bVar1) {
      in_stack_ffffffffffffffb0 =
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
           ::operator*((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                        *)&stack0xffffffffffffffc0);
      peVar3 = std::
               __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x255da7);
      uVar2 = (*peVar3->_vptr_Proxy_Function_Base[4])();
      if ((uVar2 & 1) != 0) {
        in_stack_ffffffffffffffa8 =
             std::
             __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x255dc0);
        pvVar4 = std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
                 operator[](in_RDX,0);
        uVar2 = (*in_stack_ffffffffffffffa8->_vptr_Proxy_Function_Base[7])
                          (in_stack_ffffffffffffffa8,pvVar4,in_R8);
        if ((uVar2 & 1) != 0) {
          return true;
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
      ::operator++((__normal_iterator<const_std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_*,_std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>
                    *)&stack0xffffffffffffffc0);
    }
  }
  return false;
}

Assistant:

bool is_attribute_call(const std::vector<Proxy_Function> &t_funs, const std::vector<Boxed_Value> &t_params,
            bool t_has_params, const Type_Conversions_State &t_conversions) const
        {
          if (!t_has_params || t_params.empty()) {
            return false;
          }

          for (const auto &fun : t_funs) {
            if (fun->is_attribute_function()) {
              if (fun->compare_first_type(t_params[0], t_conversions)) {
                return true;
              }
            }
          }

          return false;
        }